

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O1

void rgbcx::prepare_bc1_single_color_table
               (bc1_match_entry *pTable,uint8_t *pExpand,int size,bc1_approx_mode mode)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  bc1_match_entry *pbVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  
  lVar4 = 0;
  do {
    if (0 < size) {
      pbVar5 = pTable + lVar4;
      iVar13 = 0x100;
      uVar8 = 0;
      uVar9 = 0;
      do {
        uVar12 = (uint)pExpand[uVar9];
        uVar11 = 0;
        uVar10 = uVar8;
        do {
          uVar6 = (uint)pExpand[uVar11];
          if (size == 0x20) {
            if (mode == cBC1IdealRound4) {
LAB_001184e4:
              uVar2 = uVar12 + 1 + uVar6 * 2;
            }
            else {
              if (mode == cBC1AMD) {
LAB_001184d7:
                uVar2 = uVar6 * 0x2b + uVar12 * 0x15 + 0x20 >> 6;
                goto LAB_001184fa;
              }
              if (mode == cBC1NVidia) {
                uVar2 = (uint)(uVar10 >> 3);
                goto LAB_001184fa;
              }
LAB_001184eb:
              uVar2 = uVar12 + uVar6 * 2;
            }
            uVar2 = uVar2 / 3;
          }
          else {
            if (mode == cBC1IdealRound4) goto LAB_001184e4;
            if (mode == cBC1AMD) goto LAB_001184d7;
            if (mode != cBC1NVidia) goto LAB_001184eb;
            iVar3 = uVar12 - uVar6;
            iVar1 = iVar3 + 3;
            if (-1 < iVar3) {
              iVar1 = iVar3;
            }
            iVar1 = (iVar1 >> 2) + uVar6 * 0x100;
            iVar7 = iVar3 * 0x50 + iVar1 + 0x80;
            iVar1 = iVar3 * 0x50 + 0x17f + iVar1;
            if (-1 < iVar7) {
              iVar1 = iVar7;
            }
            uVar2 = iVar1 >> 8;
          }
LAB_001184fa:
          iVar3 = uVar2 - (int)lVar4;
          iVar1 = -iVar3;
          if (0 < iVar3) {
            iVar1 = iVar3;
          }
          if ((mode == cBC1IdealRound4) || (mode == cBC1Ideal)) {
            iVar7 = uVar6 - uVar12;
            iVar3 = -iVar7;
            if (0 < iVar7) {
              iVar3 = iVar7;
            }
            iVar1 = iVar1 + (int)((ulong)(uint)(iVar3 * 3) * 0x28f5c29 >> 0x20);
          }
          if ((iVar1 < iVar13) || ((uVar9 == uVar11 && (iVar1 == iVar13)))) {
            pbVar5->m_hi = (uint8_t)uVar11;
            pbVar5->m_lo = (uint8_t)uVar9;
            pbVar5->m_e = (uint8_t)iVar1;
            iVar13 = iVar1;
          }
          uVar11 = uVar11 + 1;
          uVar10 = (ulong)((int)uVar10 + 0x2c);
        } while ((uint)size != uVar11);
        uVar9 = uVar9 + 1;
        uVar8 = (ulong)((int)uVar8 + 0x16);
      } while (uVar9 != (uint)size);
    }
    lVar4 = lVar4 + 1;
    if (lVar4 == 0x100) {
      return;
    }
  } while( true );
}

Assistant:

static void prepare_bc1_single_color_table(bc1_match_entry* pTable, const uint8_t* pExpand, int size, bc1_approx_mode mode)
	{
		for (int i = 0; i < 256; i++)
		{
			int lowest_e = 256;
			for (int lo = 0; lo < size; lo++)
			{
				const int lo_e = pExpand[lo];

				for (int hi = 0; hi < size; hi++)
				{
					const int hi_e = pExpand[hi];

					const int v = (size == 32) ? interp_5(hi, lo, hi_e, lo_e, mode) : interp_6(hi, lo, hi_e, lo_e, mode);
					
					int e = iabs(v - i);

					if ((mode == bc1_approx_mode::cBC1Ideal) || (mode == bc1_approx_mode::cBC1IdealRound4))
						e += (iabs(hi_e - lo_e) * 3) / 100;

					// Favor equal endpoints, for lower error on actual GPU's which approximate the interpolation.
					if ((e < lowest_e) || ((e == lowest_e) && (lo == hi)))
					{
						pTable[i].m_hi = static_cast<uint8_t>(hi);
						pTable[i].m_lo = static_cast<uint8_t>(lo);
						
						assert(e <= UINT8_MAX);
						pTable[i].m_e = static_cast<uint8_t>(e);

						lowest_e = e;
					}

				} // hi
			} // lo
		}
	}